

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::CommissionerSafe::SetPendingDataset
          (Error *__return_storage_ptr__,CommissionerSafe *this,PendingOperationalDataset *aDataset)

{
  promise<ot::commissioner::Error> pro;
  __basic_future<ot::commissioner::Error> _Stack_68;
  promise<ot::commissioner::Error> local_58;
  promise<ot::commissioner::Error> *local_40;
  undefined8 local_38;
  code *local_30;
  code *local_28;
  
  std::promise<ot::commissioner::Error>::promise(&local_58);
  local_38 = 0;
  local_28 = std::
             _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:375:32)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:375:32)>
             ::_M_manager;
  local_40 = &local_58;
  (*(this->super_Commissioner)._vptr_Commissioner[0x21])(this,&local_40,aDataset);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,3);
  }
  std::__basic_future<ot::commissioner::Error>::__basic_future(&_Stack_68,&local_58._M_future);
  std::future<ot::commissioner::Error>::get
            (__return_storage_ptr__,(future<ot::commissioner::Error> *)&_Stack_68);
  if (_Stack_68._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (_Stack_68._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<ot::commissioner::Error>::~promise(&local_58);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerSafe::SetPendingDataset(const PendingOperationalDataset &aDataset)
{
    std::promise<Error> pro;
    auto                wait = [&pro](Error aError) { pro.set_value(aError); };

    SetPendingDataset(wait, aDataset);
    return pro.get_future().get();
}